

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::
InitializeableArray(InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *this,
                   initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init)

{
  HeaderTestCase *__dest;
  size_t capacity;
  
  capacity = init._M_len;
  __dest = (HeaderTestCase *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x20,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  if (capacity != 0) {
    memcpy(__dest,init._M_array,capacity << 5);
  }
  (this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>).ptr = __dest;
  (this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>).size_ = capacity;
  (this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>).disposer =
       (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return;
}

Assistant:

InitializeableArray(std::initializer_list<T> init)
      : Array<T>(kj::heapArray(init)) {}